

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O3

field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_> * __thiscall
discordpp::field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>::operator=
          (field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_> *this,
          field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_> *f)

{
  _Head_base<0UL,_std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_*,_false> __x
  ;
  vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_> *this_00;
  
  __x._M_head_impl =
       (f->t_)._M_t.
       super___uniq_ptr_impl<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>,_std::default_delete<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_*,_std::default_delete<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>_>
       .
       super__Head_base<0UL,_std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_*,_false>
       ._M_head_impl;
  if (__x._M_head_impl == (vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_> *)0x0) {
    this_00 = (pointer)0x0;
  }
  else {
    this_00 = (vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_> *)operator_new(0x18);
    std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>::vector
              (this_00,__x._M_head_impl);
  }
  std::
  __uniq_ptr_impl<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>,_std::default_delete<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>,_std::default_delete<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>_>
           *)this,this_00);
  this->s_ = present_e;
  return this;
}

Assistant:

field<T> &operator=(const field<T> &f) {
        t_.reset(f.t_ ? new T(*f.t_) : nullptr);
        s_ = present_e;
        return *this;
    }